

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTargetInternals::ComputeLinkImplementationLibraries
          (cmTargetInternals *this,cmTarget *thisTarget,string *config,
          OptionalLinkImplementation *impl,cmTarget *head)

{
  string *__rhs;
  pointer pcVar1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  pointer pbVar3;
  __type _Var4;
  bool bVar5;
  PolicyStatus PVar6;
  LinkLibraryType LVar7;
  char *pcVar8;
  cmTarget *pcVar9;
  ostream *poVar10;
  cmake *this_00;
  _Rb_tree_node_base *p_Var11;
  PolicyID id;
  pointer __rhs_00;
  string *item;
  pointer item_00;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  llibs;
  string local_2c0;
  string evaluated;
  string name;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  cmTarget *local_240;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  __rhs_00 = (this->LinkImplementationPropertyEntries).
             super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
             super__Vector_impl_data._M_start;
  pcVar1 = (this->LinkImplementationPropertyEntries).
           super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __rhs = &thisTarget->Name;
  do {
    if (__rhs_00 == pcVar1) {
      LVar7 = cmTarget::ComputeLinkType(thisTarget,config);
      for (item_00 = (thisTarget->OriginalLinkLibraries).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          item_00 !=
          (thisTarget->OriginalLinkLibraries).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; item_00 = item_00 + 1) {
        if ((item_00->second != GENERAL) && (item_00->second != LVar7)) {
          cmTarget::CheckCMP0004((string *)&dagChecker,thisTarget,&item_00->first);
          _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&dagChecker,__rhs);
          if ((!_Var4) && (dagChecker.Target._M_dataplus._M_p != (pointer)0x0)) {
            pcVar9 = cmTarget::FindTargetToLink(thisTarget,(string *)&dagChecker);
            std::__cxx11::string::string((string *)&e,(string *)&dagChecker);
            local_240 = pcVar9;
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                      (&(impl->super_LinkImplementation).super_LinkImplementationLibraries.
                        WrongConfigLibraries,(cmLinkItem *)&e);
            std::__cxx11::string::~string((string *)&e);
          }
          std::__cxx11::string::~string((string *)&dagChecker);
        }
      }
      return;
    }
    llibs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    llibs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    llibs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&e,"LINK_LIBRARIES",(allocator *)&evaluated);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&dagChecker,__rhs,(string *)&e,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&e);
    cmGeneratorExpression::cmGeneratorExpression(&ge,&__rhs_00->Backtrace);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&e,(string *)&ge);
    cge.x_ = (cmCompiledGeneratorExpression *)_e;
    _e = (pointer)0x0;
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&e);
    _e = (pointer)&local_250;
    local_250._M_local_buf[0] = '\0';
    pcVar8 = cmCompiledGeneratorExpression::Evaluate
                       (cge.x_,thisTarget->Makefile,config,false,head,&dagChecker,(string *)&e);
    std::__cxx11::string::string((string *)&evaluated,pcVar8,(allocator *)&name);
    std::__cxx11::string::~string((string *)&e);
    cmSystemTools::ExpandListArgument(&evaluated,&llibs,false);
    item = llibs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    if ((cge.x_)->HadHeadSensitiveCondition == true) {
      impl->HadHeadSensitiveCondition = true;
    }
    for (; pbVar3 = llibs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
        item != llibs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; item = item + 1) {
      cmTarget::CheckCMP0004(&name,thisTarget,item);
      _Var4 = std::operator==(&name,__rhs);
      if ((_Var4) || (name._M_string_length == 0)) {
        _Var4 = std::operator==(&name,__rhs);
        if (_Var4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          PVar6 = cmTarget::GetPolicyStatusCMP0038(thisTarget);
          if (PVar6 != OLD) {
            bVar5 = PVar6 == WARN;
            if (bVar5) {
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2c0,(cmPolicies *)0x26,id);
              poVar10 = std::operator<<((ostream *)&e,(string *)&local_2c0);
              std::operator<<(poVar10,"\n");
              std::__cxx11::string::~string((string *)&local_2c0);
            }
            poVar10 = std::operator<<((ostream *)&e,"Target \"");
            poVar10 = std::operator<<(poVar10,(string *)__rhs);
            std::operator<<(poVar10,"\" links to itself.");
            this_00 = cmMakefile::GetCMakeInstance(thisTarget->Makefile);
            std::__cxx11::stringbuf::str();
            cmake::IssueMessage(this_00,(uint)!bVar5,&local_2c0,
                                &((thisTarget->Internal).Pointer)->Backtrace);
            std::__cxx11::string::~string((string *)&local_2c0);
            if (!bVar5) {
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
              std::__cxx11::string::~string((string *)&name);
              goto LAB_002ca3fc;
            }
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        }
      }
      else {
        pcVar9 = cmTarget::FindTargetToLink(thisTarget,&name);
        bVar5 = std::operator!=(&evaluated,&__rhs_00->Value);
        cmLinkImplItem::cmLinkImplItem((cmLinkImplItem *)&e,&name,pcVar9,&__rhs_00->Backtrace,bVar5)
        ;
        std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::emplace_back<cmLinkImplItem>
                  ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)impl,
                   (cmLinkImplItem *)&e);
        cmLinkImplItem::~cmLinkImplItem((cmLinkImplItem *)&e);
      }
      std::__cxx11::string::~string((string *)&name);
    }
    psVar2 = &(cge.x_)->SeenTargetProperties;
    for (p_Var11 = ((cge.x_)->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left;
        (_Rb_tree_header *)p_Var11 != &(psVar2->_M_t)._M_impl.super__Rb_tree_header;
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
      pcVar8 = cmTarget::GetProperty(thisTarget,(string *)(p_Var11 + 1));
      if (pcVar8 == (char *)0x0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&thisTarget->LinkImplicitNullProperties,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (p_Var11 + 1));
      }
    }
    cmCompiledGeneratorExpression::GetMaxLanguageStandard
              (cge.x_,thisTarget,&thisTarget->MaxLanguageStandards);
LAB_002ca3fc:
    std::__cxx11::string::~string((string *)&evaluated);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
    cmGeneratorExpression::~cmGeneratorExpression(&ge);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&llibs);
    __rhs_00 = __rhs_00 + 1;
    if (item != pbVar3) {
      return;
    }
  } while( true );
}

Assistant:

void
cmTargetInternals::ComputeLinkImplementationLibraries(
  cmTarget const* thisTarget,
  const std::string& config,
  OptionalLinkImplementation& impl,
  cmTarget const* head) const
{
  // Collect libraries directly linked in this configuration.
  for (std::vector<cmValueWithOrigin>::const_iterator
      le = this->LinkImplementationPropertyEntries.begin(),
      end = this->LinkImplementationPropertyEntries.end();
      le != end; ++le)
    {
    std::vector<std::string> llibs;
    cmGeneratorExpressionDAGChecker dagChecker(
                                        thisTarget->GetName(),
                                        "LINK_LIBRARIES", 0, 0);
    cmGeneratorExpression ge(&le->Backtrace);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> const cge =
      ge.Parse(le->Value);
    std::string const evaluated =
      cge->Evaluate(thisTarget->Makefile, config, false, head, &dagChecker);
    cmSystemTools::ExpandListArgument(evaluated, llibs);
    if(cge->GetHadHeadSensitiveCondition())
      {
      impl.HadHeadSensitiveCondition = true;
      }

    for(std::vector<std::string>::const_iterator li = llibs.begin();
        li != llibs.end(); ++li)
      {
      // Skip entries that resolve to the target itself or are empty.
      std::string name = thisTarget->CheckCMP0004(*li);
      if(name == thisTarget->GetName() || name.empty())
        {
        if(name == thisTarget->GetName())
          {
          bool noMessage = false;
          cmake::MessageType messageType = cmake::FATAL_ERROR;
          std::ostringstream e;
          switch(thisTarget->GetPolicyStatusCMP0038())
            {
            case cmPolicies::WARN:
              {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0038) << "\n";
              messageType = cmake::AUTHOR_WARNING;
              }
              break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
            }

          if(!noMessage)
            {
            e << "Target \"" << thisTarget->GetName() << "\" links to itself.";
            thisTarget->Makefile->GetCMakeInstance()->IssueMessage(
              messageType, e.str(), thisTarget->GetBacktrace());
            if (messageType == cmake::FATAL_ERROR)
              {
              return;
              }
            }
          }
        continue;
        }

      // The entry is meant for this configuration.
      impl.Libraries.push_back(
        cmLinkImplItem(name, thisTarget->FindTargetToLink(name),
                       le->Backtrace, evaluated != le->Value));
      }

    std::set<std::string> const& seenProps = cge->GetSeenTargetProperties();
    for (std::set<std::string>::const_iterator it = seenProps.begin();
        it != seenProps.end(); ++it)
      {
      if (!thisTarget->GetProperty(*it))
        {
        thisTarget->LinkImplicitNullProperties.insert(*it);
        }
      }
    cge->GetMaxLanguageStandard(thisTarget, thisTarget->MaxLanguageStandards);
    }

  cmTarget::LinkLibraryType linkType = thisTarget->ComputeLinkType(config);
  cmTarget::LinkLibraryVectorType const& oldllibs =
    thisTarget->GetOriginalLinkLibraries();
  for(cmTarget::LinkLibraryVectorType::const_iterator li = oldllibs.begin();
      li != oldllibs.end(); ++li)
    {
    if(li->second != cmTarget::GENERAL && li->second != linkType)
      {
      std::string name = thisTarget->CheckCMP0004(li->first);
      if(name == thisTarget->GetName() || name.empty())
        {
        continue;
        }
      // Support OLD behavior for CMP0003.
      impl.WrongConfigLibraries.push_back(
        cmLinkItem(name, thisTarget->FindTargetToLink(name)));
      }
    }
}